

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void mario::detail::resetTimerfd(int timerfd,Timestamp expiration)

{
  int iVar1;
  Timestamp TVar2;
  Writer *pWVar3;
  ulong uVar4;
  itimerspec oldValue;
  itimerspec local_d8;
  itimerspec local_b8;
  Writer local_98;
  
  local_b8.it_interval.tv_sec = 0;
  local_b8.it_interval.tv_nsec = 0;
  local_b8.it_value.tv_sec = 0;
  local_b8.it_value.tv_nsec = 0;
  local_d8.it_interval.tv_sec = 0;
  local_d8.it_interval.tv_nsec = 0;
  local_d8.it_value.tv_sec = 0;
  local_d8.it_value.tv_nsec = 0;
  TVar2 = Timestamp::now();
  uVar4 = 100;
  if (100 < expiration._microSecondsSinceEpoch - TVar2._microSecondsSinceEpoch) {
    uVar4 = expiration._microSecondsSinceEpoch - TVar2._microSecondsSinceEpoch;
  }
  local_b8.it_value.tv_sec = uVar4 / 1000000;
  local_b8.it_value.tv_nsec = (uVar4 % 1000000) * 1000;
  iVar1 = timerfd_settime(timerfd,0,&local_b8,&local_d8);
  if (iVar1 != 0) {
    local_98._vptr_Writer = (_func_int **)&PTR__Writer_0012af10;
    local_98.m_msg = (LogMessage *)0x0;
    local_98.m_level = Fatal;
    local_98.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TimerQueue.cpp"
    ;
    local_98.m_line = 0x3d;
    local_98.m_func = "void mario::detail::resetTimerfd(int, Timestamp)";
    local_98.m_verboseLevel = 0;
    local_98.m_logger = (Logger *)0x0;
    local_98.m_proceed = false;
    local_98.m_messageBuilder.m_logger = (Logger *)0x0;
    local_98.m_messageBuilder.m_containerLogSeperator = "";
    local_98.m_dispatchAction = NormalLog;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_98,1,"default");
    if (pWVar3->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar3->m_messageBuilder,"timerfd_settime()");
    }
    el::base::Writer::~Writer(&local_98);
  }
  return;
}

Assistant:

void resetTimerfd(int timerfd, Timestamp expiration) {
    struct itimerspec newValue;
    struct itimerspec oldValue;
    bzero(&newValue, sizeof(newValue));
    bzero(&oldValue, sizeof(oldValue));

    newValue.it_value = howMuchTimeFromNow(expiration);
    int ret = ::timerfd_settime(timerfd, 0, &newValue, &oldValue);
    if (ret) {
        LOG(FATAL) << "timerfd_settime()";
    }
}